

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim.cpp
# Opt level: O0

void amrex::algoim::compute_integrals(MultiFab *intgmf,IntVect nghost)

{
  literals *plVar1;
  longdouble lVar2;
  int iVar3;
  bool bVar4;
  FabFactory<amrex::FArrayBox> *pFVar5;
  MFItInfo *this;
  EBCellFlagFab *this_00;
  FabArrayBase *in_RDI;
  Array4<const_amrex::EBCellFlag> *this_01;
  Real RVar6;
  IntVect IVar7;
  QuadratureRule q;
  EBPlane phi;
  int n_1;
  EBCellFlag ebflag;
  int i_2;
  int j_2;
  int k_2;
  Dim3 hi;
  Dim3 lo;
  Array4<const_amrex::EBCellFlag> *fg;
  Array4<const_double> *bn;
  Array4<const_double> *bc;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType typ;
  EBCellFlagFab *flagfab;
  Array4<double> *intg;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  FabArray<amrex::EBCellFlagFab> *flags;
  MultiCutFab *bnorm;
  MultiCutFab *bcent;
  EBFArrayBoxFactory *my_factory;
  Real offth_1;
  Real twelfth_1;
  Real offth;
  Real twelfth;
  int i_3;
  Real r;
  int i_4;
  Real r_1;
  int i_5;
  Real r_2;
  int i_6;
  Real r_3;
  int i_7;
  Real r_4;
  int i_8;
  Real r_5;
  int i_9;
  Real r_6;
  int i_10;
  Real r_7;
  int i_11;
  Real r_8;
  int i_12;
  Real r_9;
  int i_13;
  Real r_10;
  int i_14;
  Real r_11;
  int i_15;
  Real r_12;
  int i_16;
  Real r_13;
  int i_17;
  Real r_14;
  int i_18;
  Real r_15;
  int i_19;
  Real r_16;
  int i_20;
  Real r_17;
  int i_21;
  Real r_18;
  MFIter *in_stack_ffffffffffffca08;
  undefined2 in_stack_ffffffffffffca10;
  undefined6 in_stack_ffffffffffffca12;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffca18;
  MFItInfo *in_stack_ffffffffffffca20;
  int *piVar8;
  MFItInfo *in_stack_ffffffffffffca30;
  FabArrayBase *in_stack_ffffffffffffca38;
  MFIter *in_stack_ffffffffffffca40;
  IntVect *in_stack_ffffffffffffca48;
  MFIter *in_stack_ffffffffffffca50;
  EBPlane *in_stack_ffffffffffffca78;
  Array4<const_amrex::EBCellFlag> *in_stack_ffffffffffffcb30;
  EBCellFlagFab *in_stack_ffffffffffffcb38;
  undefined1 local_343b [2];
  undefined1 local_3439 [2];
  undefined1 local_3437 [2];
  undefined1 local_3435 [2];
  undefined1 local_3433 [2];
  undefined1 local_3431 [2];
  undefined1 local_342f [2];
  undefined1 local_342d [2];
  undefined1 local_342b [2];
  undefined1 local_3429;
  undefined1 local_3428 [16];
  Real aRStack_3418 [2];
  double adStack_3408 [1021];
  EBPlane local_1420;
  int local_13ec;
  uint local_13e8;
  int local_13e4;
  int local_13e0;
  int local_13dc;
  undefined8 local_13d8;
  int local_13d0;
  undefined8 local_13c4;
  int local_13bc;
  undefined8 local_13b8;
  int local_13b0;
  undefined8 local_13a8;
  int local_13a0;
  Array4<const_amrex::EBCellFlag> local_1398;
  Array4<const_amrex::EBCellFlag> *local_1358;
  long local_1350 [8];
  long *local_1310;
  long local_1308 [8];
  long *local_12c8;
  int local_12bc;
  int local_12b8;
  int local_12b4;
  undefined8 local_12b0;
  int local_12a8;
  undefined8 local_129c;
  int local_1294;
  undefined8 local_1290;
  int local_1288;
  undefined8 local_1280;
  int local_1278;
  int local_1270;
  int local_126c;
  int local_1268;
  int local_1264;
  undefined8 local_1260;
  int local_1258;
  undefined8 local_124c;
  int local_1244;
  undefined8 local_1240;
  int local_1238;
  undefined8 local_1230;
  int local_1228;
  FabType local_1224;
  EBCellFlagFab *local_1220;
  Array4<const_amrex::EBCellFlag> local_1218;
  Array4<const_amrex::EBCellFlag> *local_11d8;
  int local_11cc [7];
  int *local_11b0;
  MFIter local_11a8;
  MFItInfo local_1144;
  FabArray<amrex::EBCellFlagFab> *local_1130;
  MultiCutFab *local_1128;
  MultiCutFab *local_1120;
  long local_1118;
  int local_1110 [3];
  undefined8 local_10fc;
  int local_10f4;
  undefined8 local_10d8 [2];
  undefined8 *local_10c8;
  undefined8 *local_10c0;
  undefined8 local_10b8;
  int local_10b0;
  int *local_10a8;
  int local_109c;
  int iStack_1098;
  int local_1094;
  undefined8 local_1090;
  int local_1088;
  int *local_1080;
  int local_1074;
  int iStack_1070;
  int local_106c;
  undefined8 local_1068;
  int local_1060;
  int *local_1058;
  int local_104c;
  int iStack_1048;
  int local_1044;
  undefined8 local_1040;
  int local_1038;
  int *local_1030;
  int local_1024;
  int iStack_1020;
  int local_101c;
  undefined8 local_1018;
  int local_1010;
  int *local_1008;
  int local_ffc;
  int iStack_ff8;
  int local_ff4;
  undefined8 local_ff0;
  int local_fe8;
  int *local_fe0;
  int local_fd4;
  int iStack_fd0;
  int local_fcc;
  undefined4 local_fc8;
  int local_fc4;
  int local_fc0;
  int local_fbc;
  Array4<const_amrex::EBCellFlag> *local_fb8;
  undefined4 local_fb0;
  int local_fac;
  int local_fa8;
  int local_fa4;
  Array4<const_amrex::EBCellFlag> *local_fa0;
  undefined4 local_f98;
  int local_f94;
  int local_f90;
  int local_f8c;
  Array4<const_amrex::EBCellFlag> *local_f88;
  undefined4 local_f80;
  int local_f7c;
  int local_f78;
  int local_f74;
  Array4<const_amrex::EBCellFlag> *local_f70;
  undefined4 local_f68;
  int local_f64;
  int local_f60;
  int local_f5c;
  Array4<const_amrex::EBCellFlag> *local_f58;
  undefined4 local_f50;
  int local_f4c;
  int local_f48;
  int local_f44;
  Array4<const_amrex::EBCellFlag> *local_f40;
  undefined4 local_f38;
  int local_f34;
  int local_f30;
  int local_f2c;
  Array4<const_amrex::EBCellFlag> *local_f28;
  undefined4 local_f20;
  int local_f1c;
  int local_f18;
  int local_f14;
  Array4<const_amrex::EBCellFlag> *local_f10;
  undefined4 local_f08;
  int local_f04;
  int local_f00;
  int local_efc;
  Array4<const_amrex::EBCellFlag> *local_ef8;
  undefined4 local_ef0;
  int local_eec;
  int local_ee8;
  int local_ee4;
  Array4<const_amrex::EBCellFlag> *local_ee0;
  undefined4 local_ed8;
  int local_ed4;
  int local_ed0;
  int local_ecc;
  Array4<const_amrex::EBCellFlag> *local_ec8;
  undefined4 local_ec0;
  int local_ebc;
  int local_eb8;
  int local_eb4;
  Array4<const_amrex::EBCellFlag> *local_eb0;
  undefined4 local_ea8;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  Array4<const_amrex::EBCellFlag> *local_e98;
  undefined4 local_e90;
  int local_e8c;
  int local_e88;
  int local_e84;
  Array4<const_amrex::EBCellFlag> *local_e80;
  undefined4 local_e78;
  int local_e74;
  int local_e70;
  int local_e6c;
  Array4<const_amrex::EBCellFlag> *local_e68;
  undefined4 local_e60;
  int local_e5c;
  int local_e58;
  int local_e54;
  Array4<const_amrex::EBCellFlag> *local_e50;
  undefined4 local_e48;
  int local_e44;
  int local_e40;
  int local_e3c;
  Array4<const_amrex::EBCellFlag> *local_e38;
  undefined4 local_e30;
  int local_e2c;
  int local_e28;
  int local_e24;
  Array4<const_amrex::EBCellFlag> *local_e20;
  undefined4 local_e18;
  int local_e14;
  int local_e10;
  int local_e0c;
  Array4<const_amrex::EBCellFlag> *local_e08;
  int local_e00;
  int local_dfc;
  int local_df8;
  int local_df4;
  Array4<const_amrex::EBCellFlag> *local_df0;
  int local_de8;
  int local_de4;
  int local_de0;
  int local_ddc;
  Array4<const_amrex::EBCellFlag> *local_dd8;
  undefined8 local_dd0;
  undefined8 local_dc8;
  Array4<const_amrex::EBCellFlag> *local_dc0;
  int local_db4;
  int local_db0;
  int local_dac;
  undefined4 local_da8;
  int local_da4;
  int local_da0;
  int local_d9c;
  Array4<const_amrex::EBCellFlag> *local_d98;
  undefined4 local_d90;
  int local_d8c;
  int local_d88;
  int local_d84;
  Array4<const_amrex::EBCellFlag> *local_d80;
  undefined4 local_d78;
  int local_d74;
  int local_d70;
  int local_d6c;
  Array4<const_amrex::EBCellFlag> *local_d68;
  undefined4 local_d60;
  int local_d5c;
  int local_d58;
  int local_d54;
  Array4<const_amrex::EBCellFlag> *local_d50;
  undefined4 local_d48;
  int local_d44;
  int local_d40;
  int local_d3c;
  Array4<const_amrex::EBCellFlag> *local_d38;
  undefined4 local_d30;
  int local_d2c;
  int local_d28;
  int local_d24;
  Array4<const_amrex::EBCellFlag> *local_d20;
  undefined4 local_d18;
  int local_d14;
  int local_d10;
  int local_d0c;
  Array4<const_amrex::EBCellFlag> *local_d08;
  undefined4 local_d00;
  int local_cfc;
  int local_cf8;
  int local_cf4;
  Array4<const_amrex::EBCellFlag> *local_cf0;
  undefined4 local_ce8;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  Array4<const_amrex::EBCellFlag> *local_cd8;
  undefined4 local_cd0;
  int local_ccc;
  int local_cc8;
  int local_cc4;
  Array4<const_amrex::EBCellFlag> *local_cc0;
  undefined4 local_cb8;
  int local_cb4;
  int local_cb0;
  int local_cac;
  Array4<const_amrex::EBCellFlag> *local_ca8;
  undefined4 local_ca0;
  int local_c9c;
  int local_c98;
  int local_c94;
  Array4<const_amrex::EBCellFlag> *local_c90;
  undefined4 local_c88;
  int local_c84;
  int local_c80;
  int local_c7c;
  Array4<const_amrex::EBCellFlag> *local_c78;
  undefined4 local_c70;
  int local_c6c;
  int local_c68;
  int local_c64;
  Array4<const_amrex::EBCellFlag> *local_c60;
  undefined4 local_c58;
  int local_c54;
  int local_c50;
  int local_c4c;
  Array4<const_amrex::EBCellFlag> *local_c48;
  undefined4 local_c40;
  int local_c3c;
  int local_c38;
  int local_c34;
  Array4<const_amrex::EBCellFlag> *local_c30;
  undefined4 local_c28;
  int local_c24;
  int local_c20;
  int local_c1c;
  Array4<const_amrex::EBCellFlag> *local_c18;
  undefined4 local_c10;
  int local_c0c;
  int local_c08;
  int local_c04;
  Array4<const_amrex::EBCellFlag> *local_c00;
  undefined4 local_bf8;
  int local_bf4;
  int local_bf0;
  int local_bec;
  Array4<const_amrex::EBCellFlag> *local_be8;
  undefined8 local_be0;
  undefined8 local_bd8;
  Array4<const_amrex::EBCellFlag> *local_bd0;
  int local_bc4;
  int local_bc0;
  int local_bbc;
  undefined4 local_bb8;
  int local_bb4;
  int local_bb0;
  int local_bac;
  Array4<const_amrex::EBCellFlag> *local_ba8;
  undefined4 local_ba0;
  int local_b9c;
  int local_b98;
  int local_b94;
  Array4<const_amrex::EBCellFlag> *local_b90;
  undefined4 local_b88;
  int local_b84;
  int local_b80;
  int local_b7c;
  Array4<const_amrex::EBCellFlag> *local_b78;
  undefined4 local_b70;
  int local_b6c;
  int local_b68;
  int local_b64;
  Array4<const_amrex::EBCellFlag> *local_b60;
  undefined4 local_b58;
  int local_b54;
  int local_b50;
  int local_b4c;
  Array4<const_amrex::EBCellFlag> *local_b48;
  undefined4 local_b40;
  int local_b3c;
  int local_b38;
  int local_b34;
  Array4<const_amrex::EBCellFlag> *local_b30;
  undefined4 local_b28;
  int local_b24;
  int local_b20;
  int local_b1c;
  Array4<const_amrex::EBCellFlag> *local_b18;
  undefined4 local_b10;
  int local_b0c;
  int local_b08;
  int local_b04;
  Array4<const_amrex::EBCellFlag> *local_b00;
  undefined4 local_af8;
  int local_af4;
  int local_af0;
  int local_aec;
  Array4<const_amrex::EBCellFlag> *local_ae8;
  undefined4 local_ae0;
  int local_adc;
  int local_ad8;
  int local_ad4;
  Array4<const_amrex::EBCellFlag> *local_ad0;
  undefined4 local_ac8;
  int local_ac4;
  int local_ac0;
  int local_abc;
  Array4<const_amrex::EBCellFlag> *local_ab8;
  undefined4 local_ab0;
  int local_aac;
  int local_aa8;
  int local_aa4;
  Array4<const_amrex::EBCellFlag> *local_aa0;
  undefined4 local_a98;
  int local_a94;
  int local_a90;
  int local_a8c;
  Array4<const_amrex::EBCellFlag> *local_a88;
  undefined4 local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  Array4<const_amrex::EBCellFlag> *local_a70;
  undefined4 local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  Array4<const_amrex::EBCellFlag> *local_a58;
  undefined4 local_a50;
  int local_a4c;
  int local_a48;
  int local_a44;
  Array4<const_amrex::EBCellFlag> *local_a40;
  undefined4 local_a38;
  int local_a34;
  int local_a30;
  int local_a2c;
  Array4<const_amrex::EBCellFlag> *local_a28;
  undefined4 local_a20;
  int local_a1c;
  int local_a18;
  int local_a14;
  Array4<const_amrex::EBCellFlag> *local_a10;
  undefined4 local_a08;
  int local_a04;
  int local_a00;
  int local_9fc;
  Array4<const_amrex::EBCellFlag> *local_9f8;
  EBCellFlagFab *local_9f0;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  Array4<const_amrex::EBCellFlag> *local_9d8;
  uint *local_9d0;
  uint *local_9c8;
  undefined4 local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  long *local_9b0;
  undefined4 local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  long *local_998;
  undefined4 local_990;
  int local_98c;
  int local_988;
  int local_984;
  long *local_980;
  undefined4 local_978;
  int local_974;
  int local_970;
  int local_96c;
  long *local_968;
  undefined4 local_960;
  int local_95c;
  int local_958;
  int local_954;
  long *local_950;
  undefined4 local_948;
  int local_944;
  int local_940;
  int local_93c;
  long *local_938;
  int local_92c;
  double local_928;
  Array4<const_amrex::EBCellFlag> *local_920;
  undefined1 *local_918;
  int local_90c;
  double local_908;
  Array4<const_amrex::EBCellFlag> *local_900;
  undefined1 *local_8f8;
  int local_8ec;
  double local_8e8;
  Array4<const_amrex::EBCellFlag> *local_8e0;
  undefined1 *local_8d8;
  int local_8cc;
  double local_8c8;
  Array4<const_amrex::EBCellFlag> *local_8c0;
  undefined1 *local_8b8;
  int local_8ac;
  double local_8a8;
  Array4<const_amrex::EBCellFlag> *local_8a0;
  undefined1 *local_898;
  int local_88c;
  double local_888;
  Array4<const_amrex::EBCellFlag> *local_880;
  undefined1 *local_878;
  int local_86c;
  double local_868;
  Array4<const_amrex::EBCellFlag> *local_860;
  EBPlane *local_858;
  int local_84c;
  double local_848;
  Array4<const_amrex::EBCellFlag> *local_840;
  undefined1 *local_838;
  int local_82c;
  double local_828;
  Array4<const_amrex::EBCellFlag> *local_820;
  undefined1 *local_818;
  int local_80c;
  double local_808;
  Array4<const_amrex::EBCellFlag> *local_800;
  undefined1 *local_7f8;
  int local_7ec;
  double local_7e8;
  Array4<const_amrex::EBCellFlag> *local_7e0;
  undefined1 *local_7d8;
  int local_7cc;
  double local_7c8;
  Array4<const_amrex::EBCellFlag> *local_7c0;
  MFIter *local_7b8;
  int local_7ac;
  double local_7a8;
  Array4<const_amrex::EBCellFlag> *local_7a0;
  IntVect *local_798;
  int local_78c;
  double local_788;
  Array4<const_amrex::EBCellFlag> *local_780;
  int *local_778;
  int local_76c;
  double local_768;
  Array4<const_amrex::EBCellFlag> *local_760;
  int *local_758;
  int local_74c;
  double local_748;
  Array4<const_amrex::EBCellFlag> *local_740;
  int *local_738;
  int local_72c;
  double local_728;
  Array4<const_amrex::EBCellFlag> *local_720;
  undefined1 *local_718;
  int local_70c;
  double local_708;
  Array4<const_amrex::EBCellFlag> *local_700;
  int *local_6f8;
  int local_6ec;
  double local_6e8;
  Array4<const_amrex::EBCellFlag> *local_6e0;
  FabArray<amrex::FArrayBox> *local_6d8;
  undefined4 local_6cc;
  int *local_6c8;
  undefined4 local_6bc;
  int *local_6b8;
  undefined4 local_6ac;
  int *local_6a8;
  undefined4 local_69c;
  int *local_698;
  undefined4 local_68c;
  int *local_688;
  undefined4 local_67c;
  int *local_678;
  undefined4 local_66c;
  int *local_668;
  undefined4 local_65c;
  int *local_658;
  undefined4 local_64c;
  int *local_648;
  undefined4 local_63c;
  int *local_638;
  undefined4 local_62c;
  int *local_628;
  undefined4 local_61c;
  int *local_618;
  undefined4 local_60c;
  int *local_608;
  undefined4 local_5fc;
  int *local_5f8;
  undefined4 local_5ec;
  int *local_5e8;
  undefined4 local_5dc;
  int *local_5d8;
  undefined4 local_5cc;
  int *local_5c8;
  undefined4 local_5bc;
  int *local_5b8;
  Dim3 local_5b0;
  Dim3 local_5a0;
  Dim3 local_590;
  Dim3 local_580;
  int local_574;
  Box *local_570;
  EBCellFlag *local_568;
  Dim3 local_560;
  Box *local_550;
  int local_548;
  int iStack_544;
  int local_540;
  undefined4 local_53c;
  Box *local_538;
  undefined4 local_52c;
  Box *local_528;
  undefined4 local_51c;
  Box *local_518;
  Dim3 local_510;
  Box *local_500;
  int local_4f8;
  int iStack_4f4;
  int local_4f0;
  undefined4 local_4ec;
  IntVect *local_4e8;
  undefined4 local_4dc;
  IntVect *local_4d8;
  undefined4 local_4cc;
  IntVect *local_4c8;
  int local_4bc;
  BoxArray *local_4b8;
  int local_4ac;
  BoxArray *local_4a8;
  int local_49c;
  BoxArray *local_498;
  int local_48c;
  BoxArray *local_488;
  int local_47c;
  int *local_478;
  int local_46c;
  int *local_468;
  int local_45c;
  int *local_458;
  int local_44c;
  int *local_448;
  int local_43c;
  undefined1 *local_438;
  int local_42c;
  undefined1 *local_428;
  int local_41c;
  undefined1 *local_418;
  int local_40c;
  undefined1 *local_408;
  int local_3fc;
  int *local_3f8;
  int local_3ec;
  int *local_3e8;
  int local_3dc;
  int *local_3d8;
  int local_3cc;
  int *local_3c8;
  int local_3bc;
  int *local_3b8;
  int local_3ac;
  int *local_3a8;
  int local_39c;
  int *local_398;
  int local_38c;
  int *local_388;
  int local_37c;
  int *local_378;
  int local_36c;
  int *local_368;
  int local_35c;
  int *local_358;
  int local_34c;
  int *local_348;
  int local_33c;
  int *local_338;
  int local_32c;
  int *local_328;
  int local_31c;
  int *local_318;
  int local_30c;
  int *local_308;
  int local_2fc;
  FabArrayBase **local_2f8;
  int local_2ec;
  FabArrayBase **local_2e8;
  int local_2dc;
  FabArrayBase **local_2d8;
  int local_2cc;
  FabArrayBase **local_2c8;
  int local_2bc;
  undefined1 *local_2b8;
  int local_2ac;
  undefined1 *local_2a8;
  int local_29c;
  undefined1 *local_298;
  int local_28c;
  undefined1 *local_288;
  int local_27c;
  undefined1 *local_278;
  int local_26c;
  undefined1 *local_268;
  int local_25c;
  undefined1 *local_258;
  int local_24c;
  undefined1 *local_248;
  int local_23c;
  undefined1 *local_238;
  int local_22c;
  undefined1 *local_228;
  int local_21c;
  undefined1 *local_218;
  int local_20c;
  undefined1 *local_208;
  int local_1fc;
  undefined1 *local_1f8;
  int local_1ec;
  undefined1 *local_1e8;
  int local_1dc;
  undefined1 *local_1d8;
  int local_1cc;
  undefined1 *local_1c8;
  int local_1bc;
  double *local_1b8;
  int local_1ac;
  double *local_1a8;
  int local_19c;
  double *local_198;
  int local_18c;
  double *local_188;
  int local_17c;
  undefined1 *local_178;
  int local_16c;
  undefined1 *local_168;
  int local_15c;
  undefined1 *local_158;
  int local_14c;
  undefined1 *local_148;
  int local_13c;
  undefined1 *local_138;
  int local_12c;
  undefined1 *local_128;
  int local_11c;
  undefined1 *local_118;
  int local_10c;
  undefined1 *local_108;
  int local_fc;
  undefined1 *local_f8;
  int local_ec;
  undefined1 *local_e8;
  int local_dc;
  undefined1 *local_d8;
  int local_cc;
  undefined1 *local_c8;
  int local_bc;
  undefined1 *local_b8;
  int local_ac;
  undefined1 *local_a8;
  int local_9c;
  undefined1 *local_98;
  int local_8c;
  undefined1 *local_88;
  int local_7c;
  undefined1 *local_78;
  int local_6c;
  undefined1 *local_68;
  int local_5c;
  undefined1 *local_58;
  int local_4c;
  undefined1 *local_48;
  int local_3c;
  undefined1 *local_38;
  int local_2c;
  undefined1 *local_28;
  int local_1c;
  undefined1 *local_18;
  int local_c;
  undefined1 *local_8;
  
  IVar7 = FabArrayBase::nGrowVect(in_RDI);
  local_1110._0_8_ = IVar7.vect._0_8_;
  local_10fc._0_4_ = local_1110[0];
  local_10fc._4_4_ = local_1110[1];
  local_1110[2] = IVar7.vect[2];
  local_10f4 = local_1110[2];
  local_10c0 = local_10d8;
  local_10c8 = &local_10fc;
  local_1110 = IVar7.vect;
  pFVar5 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x18e3306);
  local_1118 = __dynamic_cast(pFVar5,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0);
  if (local_1118 == 0) {
    __cxa_bad_cast();
  }
  local_1120 = EBFArrayBoxFactory::getBndryCent
                         ((EBFArrayBoxFactory *)
                          CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10));
  local_1128 = EBFArrayBoxFactory::getBndryNormal
                         ((EBFArrayBoxFactory *)
                          CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10));
  local_1130 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                         ((EBFArrayBoxFactory *)
                          CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10));
  MFItInfo::MFItInfo(in_stack_ffffffffffffca20);
  this = MFItInfo::EnableTiling(&local_1144,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this,true);
  MFIter::MFIter(in_stack_ffffffffffffca40,in_stack_ffffffffffffca38,in_stack_ffffffffffffca30);
  while (bVar4 = MFIter::isValid(&local_11a8), bVar4) {
    MFIter::growntilebox(in_stack_ffffffffffffca50,in_stack_ffffffffffffca48);
    local_11b0 = local_11cc;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffca18,
               (MFIter *)CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10));
    local_11d8 = &local_1218;
    this_00 = FabArray<amrex::EBCellFlagFab>::operator[]
                        ((FabArray<amrex::EBCellFlagFab> *)
                         CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10),
                         in_stack_ffffffffffffca08);
    local_1220 = this_00;
    local_1224 = EBCellFlagFab::getType(in_stack_ffffffffffffcb38,(Box *)in_stack_ffffffffffffcb30);
    if (local_1224 == covered) {
      local_1058 = local_11b0;
      local_618 = local_11b0;
      local_61c = 0;
      local_104c = *local_11b0;
      local_628 = local_11b0;
      local_62c = 1;
      iStack_1048 = local_11b0[1];
      local_1240 = *(undefined8 *)local_11b0;
      local_638 = local_11b0;
      local_63c = 2;
      local_1238 = local_11b0[2];
      local_fe0 = local_11b0;
      local_6a8 = local_11b0 + 3;
      local_6ac = 0;
      local_fd4 = *local_6a8;
      local_6b8 = local_11b0 + 3;
      local_6bc = 1;
      iStack_fd0 = local_11b0[4];
      local_1260 = *(undefined8 *)local_6a8;
      local_6c8 = local_11b0 + 3;
      local_6cc = 2;
      local_1258 = local_11b0[5];
      for (local_1264 = 0; iVar3 = local_1238, local_124c = local_1260, local_1244 = local_1258,
          local_1230 = local_1240, local_1228 = local_1238, local_1068 = local_1240,
          local_1060 = local_1238, local_1044 = local_1238, local_ff0 = local_1260,
          local_fe8 = local_1258, local_fcc = local_1258, local_1264 < 0x13;
          local_1264 = local_1264 + 1) {
        while (local_1268 = iVar3, iVar3 = iStack_1048, local_1268 <= local_1258) {
          while (local_126c = iVar3, iVar3 = local_104c, local_126c <= iStack_fd0) {
            while (local_1270 = iVar3, local_1270 <= local_fd4) {
              local_dd8 = local_11d8;
              local_ddc = local_1270;
              local_de0 = local_126c;
              local_de4 = local_1268;
              local_de8 = local_1264;
              *(undefined8 *)
               (local_11d8->p +
               ((long)(local_1270 - (local_11d8->begin).x) +
                (long)(local_126c - (local_11d8->begin).y) * local_11d8->jstride +
                (long)(local_1268 - (local_11d8->begin).z) * local_11d8->kstride +
               (long)local_1264 * local_11d8->nstride) * 2) = 0;
              iVar3 = local_1270 + 1;
            }
            iVar3 = local_126c + 1;
          }
          iVar3 = local_1268 + 1;
        }
      }
    }
    else if (local_1224 == regular) {
      local_1080 = local_11b0;
      local_5e8 = local_11b0;
      local_5ec = 0;
      local_1074 = *local_11b0;
      local_5f8 = local_11b0;
      local_5fc = 1;
      iStack_1070 = local_11b0[1];
      local_1290 = *(undefined8 *)local_11b0;
      local_608 = local_11b0;
      local_60c = 2;
      local_12b4 = local_11b0[2];
      local_1008 = local_11b0;
      local_678 = local_11b0 + 3;
      local_67c = 0;
      local_ffc = *local_678;
      local_688 = local_11b0 + 3;
      local_68c = 1;
      iStack_ff8 = local_11b0[4];
      local_12b0 = *(undefined8 *)local_678;
      local_698 = local_11b0 + 3;
      local_69c = 2;
      local_12a8 = local_11b0[5];
      local_129c = local_12b0;
      local_1294 = local_12a8;
      local_1288 = local_12b4;
      local_1280 = local_1290;
      local_1278 = local_12b4;
      local_1090 = local_1290;
      local_1088 = local_12b4;
      local_106c = local_12b4;
      local_1018 = local_12b0;
      local_1010 = local_12a8;
      local_ff4 = local_12a8;
      for (; local_12b4 <= local_1294; local_12b4 = local_12b4 + 1) {
        for (local_12b8 = local_1280._4_4_; local_12b8 <= local_129c._4_4_;
            local_12b8 = local_12b8 + 1) {
          for (local_12bc = (int)local_1280; local_12bc <= (int)local_129c;
              local_12bc = local_12bc + 1) {
            local_bbc = local_12bc;
            local_bc0 = local_12b8;
            local_bc4 = local_12b4;
            local_bd0 = local_11d8;
            local_bd8 = 0x3fb5555555555555;
            local_be0 = 0x3f7c71c71c71c71c;
            RVar6 = literals::operator____rt((literals *)this_00,(longdouble)0);
            local_9f8 = local_bd0;
            local_9fc = local_bbc;
            local_a00 = local_bc0;
            local_a04 = local_bc4;
            local_a08 = 0;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                     (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_a10 = local_bd0;
            local_a14 = local_bbc;
            local_a18 = local_bc0;
            local_a1c = local_bc4;
            local_a20 = 1;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 + local_bd0->nstride)
                     * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_a28 = local_bd0;
            local_a2c = local_bbc;
            local_a30 = local_bc0;
            local_a34 = local_bc4;
            local_a38 = 2;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride +
                     local_bd0->nstride * 2) * 2) = RVar6;
            local_a40 = local_bd0;
            local_a44 = local_bbc;
            local_a48 = local_bc0;
            local_a4c = local_bc4;
            local_a50 = 3;
            *(undefined8 *)
             (local_bd0->p +
             ((long)(local_bbc - (local_bd0->begin).x) +
              (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
              (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride + local_bd0->nstride * 3
             ) * 2) = 0x3fb5555555555555;
            local_a58 = local_bd0;
            local_a5c = local_bbc;
            local_a60 = local_bc0;
            local_a64 = local_bc4;
            local_a68 = 4;
            *(undefined8 *)
             (local_bd0->p +
             ((long)(local_bbc - (local_bd0->begin).x) +
              (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
              (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride + local_bd0->nstride * 4
             ) * 2) = 0x3fb5555555555555;
            local_a70 = local_bd0;
            local_a74 = local_bbc;
            local_a78 = local_bc0;
            local_a7c = local_bc4;
            local_a80 = 5;
            plVar1 = (literals *)local_bd0->nstride;
            *(undefined8 *)
             (local_bd0->p +
             ((long)(local_bbc - (local_bd0->begin).x) +
              (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
              (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride + (long)plVar1 * 5) * 2)
                 = 0x3fb5555555555555;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_a88 = local_bd0;
            local_a8c = local_bbc;
            local_a90 = local_bc0;
            local_a94 = local_bc4;
            local_a98 = 6;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 6) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_aa0 = local_bd0;
            local_aa4 = local_bbc;
            local_aa8 = local_bc0;
            local_aac = local_bc4;
            local_ab0 = 7;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 7) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_ab8 = local_bd0;
            local_abc = local_bbc;
            local_ac0 = local_bc0;
            local_ac4 = local_bc4;
            local_ac8 = 8;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 8) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_ad0 = local_bd0;
            local_ad4 = local_bbc;
            local_ad8 = local_bc0;
            local_adc = local_bc4;
            local_ae0 = 9;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 9) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_ae8 = local_bd0;
            local_aec = local_bbc;
            local_af0 = local_bc0;
            local_af4 = local_bc4;
            local_af8 = 10;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 10) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_b00 = local_bd0;
            local_b04 = local_bbc;
            local_b08 = local_bc0;
            local_b0c = local_bc4;
            local_b10 = 0xb;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 0xb) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_b18 = local_bd0;
            local_b1c = local_bbc;
            local_b20 = local_bc0;
            local_b24 = local_bc4;
            local_b28 = 0xc;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 0xc) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_b30 = local_bd0;
            local_b34 = local_bbc;
            local_b38 = local_bc0;
            local_b3c = local_bc4;
            local_b40 = 0xd;
            plVar1 = (literals *)local_bd0->kstride;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * (long)plVar1 +
                     local_bd0->nstride * 0xd) * 2) = RVar6;
            RVar6 = literals::operator____rt(plVar1,(longdouble)0);
            local_b48 = local_bd0;
            local_b4c = local_bbc;
            local_b50 = local_bc0;
            local_b54 = local_bc4;
            local_b58 = 0xe;
            *(Real *)(local_bd0->p +
                     ((long)(local_bbc - (local_bd0->begin).x) +
                      (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
                      (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride +
                     local_bd0->nstride * 0xe) * 2) = RVar6;
            local_b60 = local_bd0;
            local_b64 = local_bbc;
            local_b68 = local_bc0;
            local_b6c = local_bc4;
            local_b70 = 0xf;
            *(undefined8 *)
             (local_bd0->p +
             ((long)(local_bbc - (local_bd0->begin).x) +
              (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
              (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride +
             local_bd0->nstride * 0xf) * 2) = 0x3f7c71c71c71c71c;
            local_b78 = local_bd0;
            local_b7c = local_bbc;
            local_b80 = local_bc0;
            local_b84 = local_bc4;
            local_b88 = 0x10;
            *(undefined8 *)
             (local_bd0->p +
             ((long)(local_bbc - (local_bd0->begin).x) +
              (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
              (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride +
             local_bd0->nstride * 0x10) * 2) = 0x3f7c71c71c71c71c;
            local_b90 = local_bd0;
            local_b94 = local_bbc;
            local_b98 = local_bc0;
            local_b9c = local_bc4;
            local_ba0 = 0x11;
            this_00 = (EBCellFlagFab *)local_bd0->nstride;
            *(undefined8 *)
             (local_bd0->p +
             ((long)(local_bbc - (local_bd0->begin).x) +
              (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
              (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride + (long)this_00 * 0x11)
             * 2) = 0x3f7c71c71c71c71c;
            lVar2 = (longdouble)0;
            in_stack_ffffffffffffca08 = SUB108(lVar2,0);
            in_stack_ffffffffffffca10 = (undefined2)((unkuint10)lVar2 >> 0x40);
            in_stack_ffffffffffffcb38 =
                 (EBCellFlagFab *)literals::operator____rt((literals *)this_00,lVar2);
            local_ba8 = local_bd0;
            local_bac = local_bbc;
            local_bb0 = local_bc0;
            local_bb4 = local_bc4;
            local_bb8 = 0x12;
            *(EBCellFlagFab **)
             (local_bd0->p +
             ((long)(local_bbc - (local_bd0->begin).x) +
              (long)(local_bc0 - (local_bd0->begin).y) * local_bd0->jstride +
              (long)(local_bc4 - (local_bd0->begin).z) * local_bd0->kstride +
             local_bd0->nstride * 0x12) * 2) = in_stack_ffffffffffffcb38;
          }
        }
      }
    }
    else {
      MultiCutFab::array((MultiCutFab *)
                         CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10),
                         in_stack_ffffffffffffca08);
      local_12c8 = local_1308;
      MultiCutFab::array((MultiCutFab *)
                         CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10),
                         in_stack_ffffffffffffca08);
      local_9f0 = local_1220;
      local_568 = (local_1220->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_570 = &(local_1220->super_BaseFab<amrex::EBCellFlag>).domain;
      local_574 = (local_1220->super_BaseFab<amrex::EBCellFlag>).nvar;
      local_51c = 0;
      local_548 = (local_570->smallend).vect[0];
      local_52c = 1;
      iStack_544 = (local_1220->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
      local_590.x = (local_570->smallend).vect[0];
      local_590.y = (local_570->smallend).vect[1];
      local_53c = 2;
      local_590.z = (local_1220->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_4c8 = &(local_1220->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_4cc = 0;
      local_4f8 = local_4c8->vect[0] + 1;
      local_4d8 = &(local_1220->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_4dc = 1;
      iStack_4f4 = (local_1220->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      local_4e8 = &(local_1220->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
      local_4ec = 2;
      local_5b0.z = (local_1220->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_5b0.y = iStack_4f4;
      local_5b0.x = local_4f8;
      this_01 = &local_1398;
      in_stack_ffffffffffffcb30 = this_01;
      local_1310 = local_1350;
      local_5a0._0_8_ = local_5b0._0_8_;
      local_5a0.z = local_5b0.z;
      local_580._0_8_ = local_590._0_8_;
      local_580.z = local_590.z;
      local_560._0_8_ = local_590._0_8_;
      local_560.z = local_590.z;
      local_550 = local_570;
      local_540 = local_590.z;
      local_538 = local_570;
      local_528 = local_570;
      local_518 = local_570;
      local_510._0_8_ = local_5b0._0_8_;
      local_510.z = local_5b0.z;
      local_500 = local_570;
      local_4f0 = local_5b0.z;
      Array4<const_amrex::EBCellFlag>::Array4(this_01,local_568,&local_580,&local_5a0,local_574);
      local_10a8 = local_11b0;
      local_5b8 = local_11b0;
      local_5bc = 0;
      local_109c = *local_11b0;
      local_5c8 = local_11b0;
      local_5cc = 1;
      iStack_1098 = local_11b0[1];
      local_13b8 = *(undefined8 *)local_11b0;
      local_5d8 = local_11b0;
      local_5dc = 2;
      local_13dc = local_11b0[2];
      local_1030 = local_11b0;
      local_648 = local_11b0 + 3;
      local_64c = 0;
      local_1024 = *local_648;
      local_658 = local_11b0 + 3;
      local_65c = 1;
      iStack_1020 = local_11b0[4];
      local_13d8 = *(undefined8 *)local_648;
      local_668 = local_11b0 + 3;
      local_66c = 2;
      local_13d0 = local_11b0[5];
      local_13c4 = local_13d8;
      local_13bc = local_13d0;
      local_13b0 = local_13dc;
      local_13a8 = local_13b8;
      local_13a0 = local_13dc;
      local_1358 = in_stack_ffffffffffffcb30;
      local_10b8 = local_13b8;
      local_10b0 = local_13dc;
      local_1094 = local_13dc;
      local_1040 = local_13d8;
      local_1038 = local_13d0;
      local_101c = local_13d0;
      for (; local_13dc <= local_13bc; local_13dc = local_13dc + 1) {
        for (local_13e0 = local_13a8._4_4_; local_13e0 <= local_13c4._4_4_;
            local_13e0 = local_13e0 + 1) {
          for (local_13e4 = (int)local_13a8; local_13e4 <= (int)local_13c4;
              local_13e4 = local_13e4 + 1) {
            local_9d8 = local_1358;
            local_9dc = local_13e4;
            local_9e0 = local_13e0;
            local_9e4 = local_13dc;
            local_13e8 = local_1358->p
                         [(long)(local_13e4 - (local_1358->begin).x) +
                          (long)(local_13e0 - (local_1358->begin).y) * local_1358->jstride +
                          (long)(local_13dc - (local_1358->begin).z) * local_1358->kstride].flag;
            local_9d0 = &local_13e8;
            if ((local_13e8 & 3) == 0) {
              local_dac = local_13e4;
              local_db0 = local_13e0;
              local_db4 = local_13dc;
              local_dc0 = local_11d8;
              local_dc8 = 0x3fb5555555555555;
              local_dd0 = 0x3f7c71c71c71c71c;
              RVar6 = literals::operator____rt((literals *)this_01,(longdouble)0);
              local_be8 = local_dc0;
              local_bec = local_dac;
              local_bf0 = local_db0;
              local_bf4 = local_db4;
              local_bf8 = 0;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                       (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_c00 = local_dc0;
              local_c04 = local_dac;
              local_c08 = local_db0;
              local_c0c = local_db4;
              local_c10 = 1;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 + local_dc0->nstride
                       ) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_c18 = local_dc0;
              local_c1c = local_dac;
              local_c20 = local_db0;
              local_c24 = local_db4;
              local_c28 = 2;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride +
                       local_dc0->nstride * 2) * 2) = RVar6;
              local_c30 = local_dc0;
              local_c34 = local_dac;
              local_c38 = local_db0;
              local_c3c = local_db4;
              local_c40 = 3;
              *(undefined8 *)
               (local_dc0->p +
               ((long)(local_dac - (local_dc0->begin).x) +
                (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride +
               local_dc0->nstride * 3) * 2) = 0x3fb5555555555555;
              local_c48 = local_dc0;
              local_c4c = local_dac;
              local_c50 = local_db0;
              local_c54 = local_db4;
              local_c58 = 4;
              *(undefined8 *)
               (local_dc0->p +
               ((long)(local_dac - (local_dc0->begin).x) +
                (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride +
               local_dc0->nstride * 4) * 2) = 0x3fb5555555555555;
              local_c60 = local_dc0;
              local_c64 = local_dac;
              local_c68 = local_db0;
              local_c6c = local_db4;
              local_c70 = 5;
              plVar1 = (literals *)local_dc0->nstride;
              *(undefined8 *)
               (local_dc0->p +
               ((long)(local_dac - (local_dc0->begin).x) +
                (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride + (long)plVar1 * 5) *
               2) = 0x3fb5555555555555;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_c78 = local_dc0;
              local_c7c = local_dac;
              local_c80 = local_db0;
              local_c84 = local_db4;
              local_c88 = 6;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 6) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_c90 = local_dc0;
              local_c94 = local_dac;
              local_c98 = local_db0;
              local_c9c = local_db4;
              local_ca0 = 7;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 7) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_ca8 = local_dc0;
              local_cac = local_dac;
              local_cb0 = local_db0;
              local_cb4 = local_db4;
              local_cb8 = 8;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 8) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_cc0 = local_dc0;
              local_cc4 = local_dac;
              local_cc8 = local_db0;
              local_ccc = local_db4;
              local_cd0 = 9;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 9) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_cd8 = local_dc0;
              local_cdc = local_dac;
              local_ce0 = local_db0;
              local_ce4 = local_db4;
              local_ce8 = 10;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 10) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_cf0 = local_dc0;
              local_cf4 = local_dac;
              local_cf8 = local_db0;
              local_cfc = local_db4;
              local_d00 = 0xb;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 0xb) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_d08 = local_dc0;
              local_d0c = local_dac;
              local_d10 = local_db0;
              local_d14 = local_db4;
              local_d18 = 0xc;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 0xc) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_d20 = local_dc0;
              local_d24 = local_dac;
              local_d28 = local_db0;
              local_d2c = local_db4;
              local_d30 = 0xd;
              plVar1 = (literals *)local_dc0->kstride;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * (long)plVar1 +
                       local_dc0->nstride * 0xd) * 2) = RVar6;
              RVar6 = literals::operator____rt(plVar1,(longdouble)0);
              local_d38 = local_dc0;
              local_d3c = local_dac;
              local_d40 = local_db0;
              local_d44 = local_db4;
              local_d48 = 0xe;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride +
                       local_dc0->nstride * 0xe) * 2) = RVar6;
              local_d50 = local_dc0;
              local_d54 = local_dac;
              local_d58 = local_db0;
              local_d5c = local_db4;
              local_d60 = 0xf;
              *(undefined8 *)
               (local_dc0->p +
               ((long)(local_dac - (local_dc0->begin).x) +
                (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride +
               local_dc0->nstride * 0xf) * 2) = 0x3f7c71c71c71c71c;
              local_d68 = local_dc0;
              local_d6c = local_dac;
              local_d70 = local_db0;
              local_d74 = local_db4;
              local_d78 = 0x10;
              *(undefined8 *)
               (local_dc0->p +
               ((long)(local_dac - (local_dc0->begin).x) +
                (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride +
               local_dc0->nstride * 0x10) * 2) = 0x3f7c71c71c71c71c;
              local_d80 = local_dc0;
              local_d84 = local_dac;
              local_d88 = local_db0;
              local_d8c = local_db4;
              local_d90 = 0x11;
              this_01 = (Array4<const_amrex::EBCellFlag> *)local_dc0->nstride;
              *(undefined8 *)
               (local_dc0->p +
               ((long)(local_dac - (local_dc0->begin).x) +
                (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride + (long)this_01 * 0x11
               ) * 2) = 0x3f7c71c71c71c71c;
              lVar2 = (longdouble)0;
              in_stack_ffffffffffffca08 = SUB108(lVar2,0);
              in_stack_ffffffffffffca10 = (undefined2)((unkuint10)lVar2 >> 0x40);
              RVar6 = literals::operator____rt((literals *)this_01,lVar2);
              local_d98 = local_dc0;
              local_d9c = local_dac;
              local_da0 = local_db0;
              local_da4 = local_db4;
              local_da8 = 0x12;
              *(Real *)(local_dc0->p +
                       ((long)(local_dac - (local_dc0->begin).x) +
                        (long)(local_db0 - (local_dc0->begin).y) * local_dc0->jstride +
                        (long)(local_db4 - (local_dc0->begin).z) * local_dc0->kstride +
                       local_dc0->nstride * 0x12) * 2) = RVar6;
            }
            else {
              local_9c8 = &local_13e8;
              if ((local_13e8 & 3) == 3) {
                for (local_13ec = 0; local_13ec < 0x13; local_13ec = local_13ec + 1) {
                  local_df0 = local_11d8;
                  local_df4 = local_13e4;
                  local_df8 = local_13e0;
                  local_dfc = local_13dc;
                  local_e00 = local_13ec;
                  *(undefined8 *)
                   (local_11d8->p +
                   ((long)(local_13e4 - (local_11d8->begin).x) +
                    (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                    (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                   (long)local_13ec * local_11d8->nstride) * 2) = 0;
                  this_01 = local_11d8;
                }
              }
              else {
                local_938 = local_12c8;
                local_93c = local_13e4;
                local_940 = local_13e0;
                local_944 = local_13dc;
                local_948 = 0;
                local_950 = local_12c8;
                local_954 = local_13e4;
                local_958 = local_13e0;
                local_95c = local_13dc;
                local_960 = 1;
                local_968 = local_12c8;
                local_96c = local_13e4;
                local_970 = local_13e0;
                local_974 = local_13dc;
                local_978 = 2;
                local_980 = local_1310;
                local_984 = local_13e4;
                local_988 = local_13e0;
                local_98c = local_13dc;
                local_990 = 0;
                local_998 = local_1310;
                local_99c = local_13e4;
                local_9a0 = local_13e0;
                local_9a4 = local_13dc;
                local_9a8 = 1;
                local_9b0 = local_1310;
                local_9b4 = local_13e4;
                local_9b8 = local_13e0;
                local_9bc = local_13dc;
                local_9c0 = 2;
                EBPlane::EBPlane(&local_1420,
                                 *(Real *)(*local_12c8 +
                                          ((long)(local_13e4 - (int)local_12c8[4]) +
                                           (long)(local_13e0 - *(int *)((long)local_12c8 + 0x24)) *
                                           local_12c8[1] +
                                          (long)(local_13dc - (int)local_12c8[5]) * local_12c8[2]) *
                                          8),
                                 *(Real *)(*local_12c8 +
                                          ((long)(local_13e4 - (int)local_12c8[4]) +
                                           (long)(local_13e0 - *(int *)((long)local_12c8 + 0x24)) *
                                           local_12c8[1] +
                                           (long)(local_13dc - (int)local_12c8[5]) * local_12c8[2] +
                                          local_12c8[3]) * 8),
                                 *(Real *)(*local_12c8 +
                                          ((long)(local_13e4 - (int)local_12c8[4]) +
                                           (long)(local_13e0 - *(int *)((long)local_12c8 + 0x24)) *
                                           local_12c8[1] +
                                           (long)(local_13dc - (int)local_12c8[5]) * local_12c8[2] +
                                          local_12c8[3] * 2) * 8),
                                 *(Real *)(*local_1310 +
                                          ((long)(local_13e4 - (int)local_1310[4]) +
                                           (long)(local_13e0 - *(int *)((long)local_1310 + 0x24)) *
                                           local_1310[1] +
                                          (long)(local_13dc - (int)local_1310[5]) * local_1310[2]) *
                                          8),
                                 *(Real *)(*local_1310 +
                                          ((long)(local_13e4 - (int)local_1310[4]) +
                                           (long)(local_13e0 - *(int *)((long)local_1310 + 0x24)) *
                                           local_1310[1] +
                                           (long)(local_13dc - (int)local_1310[5]) * local_1310[2] +
                                          local_1310[3]) * 8),
                                 *(Real *)(*local_1310 +
                                          ((long)(local_13e4 - (int)local_1310[4]) +
                                           (long)(local_13e0 - *(int *)((long)local_1310 + 0x24)) *
                                           local_1310[1] +
                                           (long)(local_13dc - (int)local_1310[5]) * local_1310[2] +
                                          local_1310[3] * 2) * 8));
                this_01 = (Array4<const_amrex::EBCellFlag> *)local_3428;
                quadGen(in_stack_ffffffffffffca78);
                local_918 = local_3428;
                local_920 = (Array4<const_amrex::EBCellFlag> *)&local_3429;
                local_928 = 0.0;
                for (local_92c = 0; local_92c < (int)local_3428._0_4_; local_92c = local_92c + 1) {
                  local_8 = local_3428 + 8;
                  local_c = local_92c;
                  local_18 = local_3428 + 8;
                  local_1c = local_92c;
                  local_28 = local_3428 + 8;
                  local_2c = local_92c;
                  this_01 = local_920;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_920,
                                     *(Real *)(local_8 + (long)local_92c * 0x20),
                                     aRStack_3418[(long)local_92c * 4],
                                     aRStack_3418[(long)local_92c * 4 + 1]);
                  local_38 = local_3428 + 8;
                  local_3c = local_92c;
                  local_928 = RVar6 * adStack_3408[(long)local_92c * 4] + local_928;
                }
                local_e08 = local_11d8;
                local_e0c = local_13e4;
                local_e10 = local_13e0;
                local_e14 = local_13dc;
                local_e18 = 0;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                 (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride) * 2) = local_928;
                local_8f8 = local_3428;
                local_900 = (Array4<const_amrex::EBCellFlag> *)(local_342b + 1);
                local_908 = 0.0;
                for (local_90c = 0; local_90c < (int)local_3428._0_4_; local_90c = local_90c + 1) {
                  local_48 = local_3428 + 8;
                  local_4c = local_90c;
                  local_58 = local_3428 + 8;
                  local_5c = local_90c;
                  local_68 = local_3428 + 8;
                  local_6c = local_90c;
                  this_01 = local_900;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_900,
                                     *(Real *)(local_48 + (long)local_90c * 0x20),
                                     aRStack_3418[(long)local_90c * 4],
                                     aRStack_3418[(long)local_90c * 4 + 1]);
                  local_78 = local_3428 + 8;
                  local_7c = local_90c;
                  local_908 = RVar6 * adStack_3408[(long)local_90c * 4] + local_908;
                }
                local_e20 = local_11d8;
                local_e24 = local_13e4;
                local_e28 = local_13e0;
                local_e2c = local_13dc;
                local_e30 = 1;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride) * 2) = local_908;
                local_8d8 = local_3428;
                local_8e0 = (Array4<const_amrex::EBCellFlag> *)local_342b;
                local_8e8 = 0.0;
                for (local_8ec = 0; local_8ec < (int)local_3428._0_4_; local_8ec = local_8ec + 1) {
                  local_88 = local_3428 + 8;
                  local_8c = local_8ec;
                  local_98 = local_3428 + 8;
                  local_9c = local_8ec;
                  local_a8 = local_3428 + 8;
                  local_ac = local_8ec;
                  this_01 = local_8e0;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_8e0,
                                     *(Real *)(local_88 + (long)local_8ec * 0x20),
                                     aRStack_3418[(long)local_8ec * 4],
                                     aRStack_3418[(long)local_8ec * 4 + 1]);
                  local_b8 = local_3428 + 8;
                  local_bc = local_8ec;
                  local_8e8 = RVar6 * adStack_3408[(long)local_8ec * 4] + local_8e8;
                }
                local_e38 = local_11d8;
                local_e3c = local_13e4;
                local_e40 = local_13e0;
                local_e44 = local_13dc;
                local_e48 = 2;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 2) * 2) = local_8e8;
                local_8b8 = local_3428;
                local_8c0 = (Array4<const_amrex::EBCellFlag> *)(local_342d + 1);
                local_8c8 = 0.0;
                for (local_8cc = 0; local_8cc < (int)local_3428._0_4_; local_8cc = local_8cc + 1) {
                  local_c8 = local_3428 + 8;
                  local_cc = local_8cc;
                  local_d8 = local_3428 + 8;
                  local_dc = local_8cc;
                  local_e8 = local_3428 + 8;
                  local_ec = local_8cc;
                  this_01 = local_8c0;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_8c0,
                                     *(Real *)(local_c8 + (long)local_8cc * 0x20),
                                     aRStack_3418[(long)local_8cc * 4],
                                     aRStack_3418[(long)local_8cc * 4 + 1]);
                  local_f8 = local_3428 + 8;
                  local_fc = local_8cc;
                  local_8c8 = RVar6 * adStack_3408[(long)local_8cc * 4] + local_8c8;
                }
                local_e50 = local_11d8;
                local_e54 = local_13e4;
                local_e58 = local_13e0;
                local_e5c = local_13dc;
                local_e60 = 3;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 3) * 2) = local_8c8;
                local_898 = local_3428;
                local_8a0 = (Array4<const_amrex::EBCellFlag> *)local_342d;
                local_8a8 = 0.0;
                for (local_8ac = 0; local_8ac < (int)local_3428._0_4_; local_8ac = local_8ac + 1) {
                  local_108 = local_3428 + 8;
                  local_10c = local_8ac;
                  local_118 = local_3428 + 8;
                  local_11c = local_8ac;
                  local_128 = local_3428 + 8;
                  local_12c = local_8ac;
                  this_01 = local_8a0;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_8a0,
                                     *(Real *)(local_108 + (long)local_8ac * 0x20),
                                     aRStack_3418[(long)local_8ac * 4],
                                     aRStack_3418[(long)local_8ac * 4 + 1]);
                  local_138 = local_3428 + 8;
                  local_13c = local_8ac;
                  local_8a8 = RVar6 * adStack_3408[(long)local_8ac * 4] + local_8a8;
                }
                local_e68 = local_11d8;
                local_e6c = local_13e4;
                local_e70 = local_13e0;
                local_e74 = local_13dc;
                local_e78 = 4;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 4) * 2) = local_8a8;
                local_878 = local_3428;
                local_880 = (Array4<const_amrex::EBCellFlag> *)(local_342f + 1);
                local_888 = 0.0;
                for (local_88c = 0; local_88c < (int)local_3428._0_4_; local_88c = local_88c + 1) {
                  local_148 = local_3428 + 8;
                  local_14c = local_88c;
                  local_158 = local_3428 + 8;
                  local_15c = local_88c;
                  local_168 = local_3428 + 8;
                  local_16c = local_88c;
                  this_01 = local_880;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_880,
                                     *(Real *)(local_148 + (long)local_88c * 0x20),
                                     aRStack_3418[(long)local_88c * 4],
                                     aRStack_3418[(long)local_88c * 4 + 1]);
                  local_178 = local_3428 + 8;
                  local_17c = local_88c;
                  local_888 = RVar6 * adStack_3408[(long)local_88c * 4] + local_888;
                }
                local_e80 = local_11d8;
                local_e84 = local_13e4;
                local_e88 = local_13e0;
                local_e8c = local_13dc;
                local_e90 = 5;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 5) * 2) = local_888;
                in_stack_ffffffffffffca78 = (EBPlane *)local_3428;
                local_860 = (Array4<const_amrex::EBCellFlag> *)local_342f;
                local_868 = 0.0;
                local_858 = in_stack_ffffffffffffca78;
                for (local_86c = 0; local_86c < *(int *)(in_stack_ffffffffffffca78->cent).arr;
                    local_86c = local_86c + 1) {
                  local_188 = (in_stack_ffffffffffffca78->cent).arr + 1;
                  local_18c = local_86c;
                  local_198 = (in_stack_ffffffffffffca78->cent).arr + 1;
                  local_19c = local_86c;
                  local_1a8 = (in_stack_ffffffffffffca78->cent).arr + 1;
                  local_1ac = local_86c;
                  this_01 = local_860;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_860,
                                     local_188[(long)local_86c * 4],
                                     local_198[(long)local_86c * 4 + 1],
                                     local_1a8[(long)local_86c * 4 + 2]);
                  local_1b8 = (in_stack_ffffffffffffca78->cent).arr + 1;
                  local_1bc = local_86c;
                  local_868 = RVar6 * local_1b8[(long)local_86c * 4 + 3] + local_868;
                }
                local_e98 = local_11d8;
                local_e9c = local_13e4;
                local_ea0 = local_13e0;
                local_ea4 = local_13dc;
                local_ea8 = 6;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 6) * 2) = local_868;
                local_838 = local_3428;
                local_840 = (Array4<const_amrex::EBCellFlag> *)(local_3431 + 1);
                local_848 = 0.0;
                for (local_84c = 0; local_84c < (int)local_3428._0_4_; local_84c = local_84c + 1) {
                  local_1c8 = local_3428 + 8;
                  local_1cc = local_84c;
                  local_1d8 = local_3428 + 8;
                  local_1dc = local_84c;
                  local_1e8 = local_3428 + 8;
                  local_1ec = local_84c;
                  this_01 = local_840;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_840,
                                     *(Real *)(local_1c8 + (long)local_84c * 0x20),
                                     aRStack_3418[(long)local_84c * 4],
                                     aRStack_3418[(long)local_84c * 4 + 1]);
                  local_1f8 = local_3428 + 8;
                  local_1fc = local_84c;
                  local_848 = RVar6 * adStack_3408[(long)local_84c * 4] + local_848;
                }
                local_eb0 = local_11d8;
                local_eb4 = local_13e4;
                local_eb8 = local_13e0;
                local_ebc = local_13dc;
                local_ec0 = 7;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 7) * 2) = local_848;
                local_818 = local_3428;
                local_820 = (Array4<const_amrex::EBCellFlag> *)local_3431;
                local_828 = 0.0;
                for (local_82c = 0; local_82c < (int)local_3428._0_4_; local_82c = local_82c + 1) {
                  local_208 = local_3428 + 8;
                  local_20c = local_82c;
                  local_218 = local_3428 + 8;
                  local_21c = local_82c;
                  local_228 = local_3428 + 8;
                  local_22c = local_82c;
                  this_01 = local_820;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_820,
                                     *(Real *)(local_208 + (long)local_82c * 0x20),
                                     aRStack_3418[(long)local_82c * 4],
                                     aRStack_3418[(long)local_82c * 4 + 1]);
                  local_238 = local_3428 + 8;
                  local_23c = local_82c;
                  local_828 = RVar6 * adStack_3408[(long)local_82c * 4] + local_828;
                }
                local_ec8 = local_11d8;
                local_ecc = local_13e4;
                local_ed0 = local_13e0;
                local_ed4 = local_13dc;
                local_ed8 = 8;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 8) * 2) = local_828;
                local_7f8 = local_3428;
                local_800 = (Array4<const_amrex::EBCellFlag> *)(local_3433 + 1);
                local_808 = 0.0;
                for (local_80c = 0; local_80c < (int)local_3428._0_4_; local_80c = local_80c + 1) {
                  local_248 = local_3428 + 8;
                  local_24c = local_80c;
                  local_258 = local_3428 + 8;
                  local_25c = local_80c;
                  local_268 = local_3428 + 8;
                  local_26c = local_80c;
                  this_01 = local_800;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_800,
                                     *(Real *)(local_248 + (long)local_80c * 0x20),
                                     aRStack_3418[(long)local_80c * 4],
                                     aRStack_3418[(long)local_80c * 4 + 1]);
                  local_278 = local_3428 + 8;
                  local_27c = local_80c;
                  local_808 = RVar6 * adStack_3408[(long)local_80c * 4] + local_808;
                }
                local_ee0 = local_11d8;
                local_ee4 = local_13e4;
                local_ee8 = local_13e0;
                local_eec = local_13dc;
                local_ef0 = 9;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 9) * 2) = local_808;
                local_7d8 = local_3428;
                local_7e0 = (Array4<const_amrex::EBCellFlag> *)local_3433;
                local_7e8 = 0.0;
                for (local_7ec = 0; local_7ec < (int)local_3428._0_4_; local_7ec = local_7ec + 1) {
                  local_288 = local_3428 + 8;
                  local_28c = local_7ec;
                  local_298 = local_3428 + 8;
                  local_29c = local_7ec;
                  local_2a8 = local_3428 + 8;
                  local_2ac = local_7ec;
                  this_01 = local_7e0;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_7e0,
                                     *(Real *)(local_288 + (long)local_7ec * 0x20),
                                     aRStack_3418[(long)local_7ec * 4],
                                     aRStack_3418[(long)local_7ec * 4 + 1]);
                  local_2b8 = local_3428 + 8;
                  local_2bc = local_7ec;
                  local_7e8 = RVar6 * adStack_3408[(long)local_7ec * 4] + local_7e8;
                }
                local_ef8 = local_11d8;
                local_efc = local_13e4;
                local_f00 = local_13e0;
                local_f04 = local_13dc;
                local_f08 = 10;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 10) * 2) = local_7e8;
                in_stack_ffffffffffffca50 = (MFIter *)local_3428;
                local_7c0 = (Array4<const_amrex::EBCellFlag> *)(local_3435 + 1);
                local_7c8 = 0.0;
                local_7b8 = in_stack_ffffffffffffca50;
                for (local_7cc = 0;
                    local_7cc <
                    *(int *)&(in_stack_ffffffffffffca50->m_fa)._M_t.
                             super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                             .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
                    local_7cc = local_7cc + 1) {
                  local_2c8 = &in_stack_ffffffffffffca50->fabArray;
                  local_2cc = local_7cc;
                  local_2d8 = &in_stack_ffffffffffffca50->fabArray;
                  local_2dc = local_7cc;
                  local_2e8 = &in_stack_ffffffffffffca50->fabArray;
                  local_2ec = local_7cc;
                  this_01 = local_7c0;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_7c0,
                                     (Real)local_2c8[(long)local_7cc * 4],
                                     (Real)local_2d8[(long)local_7cc * 4 + 1],
                                     (Real)local_2e8[(long)local_7cc * 4 + 2]);
                  local_2f8 = &in_stack_ffffffffffffca50->fabArray;
                  local_2fc = local_7cc;
                  local_7c8 = RVar6 * (double)local_2f8[(long)local_7cc * 4 + 3] + local_7c8;
                }
                local_f10 = local_11d8;
                local_f14 = local_13e4;
                local_f18 = local_13e0;
                local_f1c = local_13dc;
                local_f20 = 0xb;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0xb) * 2) = local_7c8;
                in_stack_ffffffffffffca48 = (IntVect *)local_3428;
                local_7a0 = (Array4<const_amrex::EBCellFlag> *)local_3435;
                local_7a8 = 0.0;
                local_798 = in_stack_ffffffffffffca48;
                for (local_7ac = 0; local_7ac < in_stack_ffffffffffffca48->vect[0];
                    local_7ac = local_7ac + 1) {
                  local_308 = in_stack_ffffffffffffca48->vect + 2;
                  local_30c = local_7ac;
                  local_318 = in_stack_ffffffffffffca48->vect + 2;
                  local_31c = local_7ac;
                  local_328 = in_stack_ffffffffffffca48->vect + 2;
                  local_32c = local_7ac;
                  this_01 = local_7a0;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_7a0,
                                     *(Real *)(local_308 + (long)local_7ac * 8),
                                     *(Real *)(local_318 + (long)local_7ac * 8 + 2),
                                     *(Real *)(local_328 + (long)local_7ac * 8 + 4));
                  local_338 = in_stack_ffffffffffffca48->vect + 2;
                  local_33c = local_7ac;
                  local_7a8 = RVar6 * *(double *)(local_338 + (long)local_7ac * 8 + 6) + local_7a8;
                }
                local_f28 = local_11d8;
                local_f2c = local_13e4;
                local_f30 = local_13e0;
                local_f34 = local_13dc;
                local_f38 = 0xc;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0xc) * 2) = local_7a8;
                piVar8 = (int *)local_3428;
                local_780 = (Array4<const_amrex::EBCellFlag> *)(local_3437 + 1);
                local_788 = 0.0;
                local_778 = piVar8;
                for (local_78c = 0; local_78c < *piVar8; local_78c = local_78c + 1) {
                  local_348 = piVar8 + 2;
                  local_34c = local_78c;
                  local_358 = piVar8 + 2;
                  local_35c = local_78c;
                  local_368 = piVar8 + 2;
                  local_36c = local_78c;
                  this_01 = local_780;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_780,
                                     *(Real *)(local_348 + (long)local_78c * 8),
                                     *(Real *)(local_358 + (long)local_78c * 8 + 2),
                                     *(Real *)(local_368 + (long)local_78c * 8 + 4));
                  local_378 = piVar8 + 2;
                  local_37c = local_78c;
                  local_788 = RVar6 * *(double *)(local_378 + (long)local_78c * 8 + 6) + local_788;
                }
                local_f40 = local_11d8;
                local_f44 = local_13e4;
                local_f48 = local_13e0;
                local_f4c = local_13dc;
                local_f50 = 0xd;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0xd) * 2) = local_788;
                piVar8 = (int *)local_3428;
                local_760 = (Array4<const_amrex::EBCellFlag> *)local_3437;
                local_768 = 0.0;
                local_758 = piVar8;
                for (local_76c = 0; local_76c < *piVar8; local_76c = local_76c + 1) {
                  local_388 = piVar8 + 2;
                  local_38c = local_76c;
                  local_398 = piVar8 + 2;
                  local_39c = local_76c;
                  local_3a8 = piVar8 + 2;
                  local_3ac = local_76c;
                  this_01 = local_760;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_760,
                                     *(Real *)(local_388 + (long)local_76c * 8),
                                     *(Real *)(local_398 + (long)local_76c * 8 + 2),
                                     *(Real *)(local_3a8 + (long)local_76c * 8 + 4));
                  local_3b8 = piVar8 + 2;
                  local_3bc = local_76c;
                  local_768 = RVar6 * *(double *)(local_3b8 + (long)local_76c * 8 + 6) + local_768;
                }
                local_f58 = local_11d8;
                local_f5c = local_13e4;
                local_f60 = local_13e0;
                local_f64 = local_13dc;
                local_f68 = 0xe;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0xe) * 2) = local_768;
                piVar8 = (int *)local_3428;
                local_740 = (Array4<const_amrex::EBCellFlag> *)(local_3439 + 1);
                local_748 = 0.0;
                local_738 = piVar8;
                for (local_74c = 0; local_74c < *piVar8; local_74c = local_74c + 1) {
                  local_3c8 = piVar8 + 2;
                  local_3cc = local_74c;
                  local_3d8 = piVar8 + 2;
                  local_3dc = local_74c;
                  local_3e8 = piVar8 + 2;
                  local_3ec = local_74c;
                  this_01 = local_740;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_740,
                                     *(Real *)(local_3c8 + (long)local_74c * 8),
                                     *(Real *)(local_3d8 + (long)local_74c * 8 + 2),
                                     *(Real *)(local_3e8 + (long)local_74c * 8 + 4));
                  local_3f8 = piVar8 + 2;
                  local_3fc = local_74c;
                  local_748 = RVar6 * *(double *)(local_3f8 + (long)local_74c * 8 + 6) + local_748;
                }
                local_f70 = local_11d8;
                local_f74 = local_13e4;
                local_f78 = local_13e0;
                local_f7c = local_13dc;
                local_f80 = 0xf;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0xf) * 2) = local_748;
                local_718 = local_3428;
                local_720 = (Array4<const_amrex::EBCellFlag> *)local_3439;
                local_728 = 0.0;
                for (local_72c = 0; local_72c < (int)local_3428._0_4_; local_72c = local_72c + 1) {
                  local_408 = local_3428 + 8;
                  local_40c = local_72c;
                  local_418 = local_3428 + 8;
                  local_41c = local_72c;
                  local_428 = local_3428 + 8;
                  local_42c = local_72c;
                  this_01 = local_720;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_720,
                                     *(Real *)(local_408 + (long)local_72c * 0x20),
                                     aRStack_3418[(long)local_72c * 4],
                                     aRStack_3418[(long)local_72c * 4 + 1]);
                  local_438 = local_3428 + 8;
                  local_43c = local_72c;
                  local_728 = RVar6 * adStack_3408[(long)local_72c * 4] + local_728;
                }
                local_f88 = local_11d8;
                local_f8c = local_13e4;
                local_f90 = local_13e0;
                local_f94 = local_13dc;
                local_f98 = 0x10;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0x10) * 2) = local_728;
                piVar8 = (int *)local_3428;
                local_700 = (Array4<const_amrex::EBCellFlag> *)(local_343b + 1);
                local_708 = 0.0;
                local_6f8 = piVar8;
                for (local_70c = 0; local_70c < *piVar8; local_70c = local_70c + 1) {
                  local_448 = piVar8 + 2;
                  local_44c = local_70c;
                  local_458 = piVar8 + 2;
                  local_45c = local_70c;
                  local_468 = piVar8 + 2;
                  local_46c = local_70c;
                  this_01 = local_700;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_700,
                                     *(Real *)(local_448 + (long)local_70c * 8),
                                     *(Real *)(local_458 + (long)local_70c * 8 + 2),
                                     *(Real *)(local_468 + (long)local_70c * 8 + 4));
                  local_478 = piVar8 + 2;
                  local_47c = local_70c;
                  local_708 = RVar6 * *(double *)(local_478 + (long)local_70c * 8 + 6) + local_708;
                }
                local_fa0 = local_11d8;
                local_fa4 = local_13e4;
                local_fa8 = local_13e0;
                local_fac = local_13dc;
                local_fb0 = 0x11;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0x11) * 2) = local_708;
                in_stack_ffffffffffffca18 = (FabArray<amrex::FArrayBox> *)local_3428;
                local_6e0 = (Array4<const_amrex::EBCellFlag> *)local_343b;
                local_6e8 = 0.0;
                local_6d8 = in_stack_ffffffffffffca18;
                for (local_6ec = 0;
                    local_6ec <
                    *(int *)&(in_stack_ffffffffffffca18->super_FabArrayBase)._vptr_FabArrayBase;
                    local_6ec = local_6ec + 1) {
                  local_488 = &(in_stack_ffffffffffffca18->super_FabArrayBase).boxarray;
                  local_48c = local_6ec;
                  local_498 = &(in_stack_ffffffffffffca18->super_FabArrayBase).boxarray;
                  local_49c = local_6ec;
                  local_4a8 = &(in_stack_ffffffffffffca18->super_FabArrayBase).boxarray;
                  local_4ac = local_6ec;
                  this_01 = local_6e0;
                  RVar6 = compute_integrals::anon_class_1_0_00000001::operator()
                                    ((anon_class_1_0_00000001 *)local_6e0,
                                     *(Real *)(&(local_488->m_bat).m_bat_type + (long)local_6ec * 8)
                                     ,*(Real *)((long)&(local_498->m_bat).m_op +
                                               (long)local_6ec * 0x20 + 4),
                                     *(Real *)((long)&(local_4a8->m_bat).m_op +
                                              (long)local_6ec * 0x20 + 0xc));
                  local_4b8 = &(in_stack_ffffffffffffca18->super_FabArrayBase).boxarray;
                  local_4bc = local_6ec;
                  local_6e8 = RVar6 * *(double *)
                                       ((long)&(local_4b8->m_bat).m_op +
                                       (long)local_6ec * 0x20 + 0x14) + local_6e8;
                }
                local_fb8 = local_11d8;
                local_fbc = local_13e4;
                local_fc0 = local_13e0;
                local_fc4 = local_13dc;
                local_fc8 = 0x12;
                *(double *)
                 (local_11d8->p +
                 ((long)(local_13e4 - (local_11d8->begin).x) +
                  (long)(local_13e0 - (local_11d8->begin).y) * local_11d8->jstride +
                  (long)(local_13dc - (local_11d8->begin).z) * local_11d8->kstride +
                 local_11d8->nstride * 0x12) * 2) = local_6e8;
              }
            }
          }
        }
      }
    }
    MFIter::operator++(&local_11a8);
  }
  MFIter::~MFIter((MFIter *)CONCAT62(in_stack_ffffffffffffca12,in_stack_ffffffffffffca10));
  return;
}

Assistant:

void
compute_integrals (MultiFab& intgmf, IntVect nghost)
{
#if (AMREX_SPACEDIM == 2)
    amrex::ignore_unused(intgmf, nghost);
    amrex::Abort("amrex::algoim::compute_integrals is 3D only");
#else

    nghost.min(intgmf.nGrowVect());
    AMREX_ASSERT(intgmf.nComp() >= numIntgs);

    const auto& my_factory = dynamic_cast<EBFArrayBoxFactory const&>(intgmf.Factory());

    // const MultiFab&    vfrac = my_factory.getVolFrac();
    const MultiCutFab& bcent = my_factory.getBndryCent();
    const MultiCutFab& bnorm = my_factory.getBndryNormal();
    const auto&        flags = my_factory.getMultiEBCellFlagFab();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if(Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(intgmf,mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(nghost);
        Array4<Real> const& intg = intgmf.array(mfi);

        const auto& flagfab = flags[mfi];
        auto typ = flagfab.getType(bx);

        if (typ == FabType::covered)
        {
            AMREX_HOST_DEVICE_FOR_4D ( bx, numIntgs, i, j, k, n,
            {
                intg(i,j,k,n) = 0.0;
            });
        }
        else if (typ == FabType::regular)
        {
            AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
            {
                set_regular(i,j,k,intg);
            });
        }
        else
        {
            // auto const& vf = vfrac.array(mfi);
            auto const& bc = bcent.array(mfi);
            auto const& bn = bnorm.array(mfi);
            auto const& fg = flagfab.array();

            if (Gpu::inLaunchRegion())
            {
                amrex::ParallelFor(bx,
                [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    const auto ebflag = fg(i,j,k);
                    if (ebflag.isRegular()) {
                        set_regular(i,j,k,intg);
                    } else if (ebflag.isCovered()) {
                        for (int n = 0; n < numIntgs; ++n) intg(i,j,k,n) = 0.0;
                    } else {
                        EBPlane phi(bc(i,j,k,0),bc(i,j,k,1),bc(i,j,k,2),
                                    bn(i,j,k,0),bn(i,j,k,1),bn(i,j,k,2));

                        const QuadratureRule q = quadGen(phi);

                        intg(i,j,k,i_S_x    ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x; });
                        intg(i,j,k,i_S_y    ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y; });
                        intg(i,j,k,i_S_z    ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z; });
                        intg(i,j,k,i_S_x2   ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x*x; });
                        intg(i,j,k,i_S_y2   ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y*y; });
                        intg(i,j,k,i_S_z2   ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z*z; });
                        intg(i,j,k,i_S_x_y  ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y; });
                        intg(i,j,k,i_S_x_z  ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z; });
                        intg(i,j,k,i_S_y_z  ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z; });
                        intg(i,j,k,i_S_x2_y ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y; });
                        intg(i,j,k,i_S_x2_z ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z; });
                        intg(i,j,k,i_S_x_y2 ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y*y; });
                        intg(i,j,k,i_S_y2_z ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z; });
                        intg(i,j,k,i_S_x_z2 ) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z*z; });
                        intg(i,j,k,i_S_y_z2 ) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z*z; });
                        intg(i,j,k,i_S_x2_y2) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y*y; });
                        intg(i,j,k,i_S_x2_z2) = q([] AMREX_GPU_DEVICE (Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z*z; });
                        intg(i,j,k,i_S_y2_z2) = q([] AMREX_GPU_DEVICE (Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z*z; });
                        intg(i,j,k,i_S_xyz  ) = q([] AMREX_GPU_DEVICE (Real x, Real y, Real z) noexcept
                                                   { return x*y*z; });
                    }
                });
            }
            else
            {
                const auto lo = amrex::lbound(bx);
                const auto hi = amrex::ubound(bx);
                for (int k = lo.z; k <= hi.z; ++k)
                for (int j = lo.y; j <= hi.y; ++j)
                for (int i = lo.x; i <= hi.x; ++i)
                {
                    const auto ebflag = fg(i,j,k);
                    if (ebflag.isRegular()) {
                        set_regular(i,j,k,intg);
                    } else if (ebflag.isCovered()) {
                        for (int n = 0; n < numIntgs; ++n) intg(i,j,k,n) = 0.0;
                    } else {
                        EBPlane phi(bc(i,j,k,0),bc(i,j,k,1),bc(i,j,k,2),
                                    bn(i,j,k,0),bn(i,j,k,1),bn(i,j,k,2));

                        const QuadratureRule q = quadGen(phi);

                        intg(i,j,k,i_S_x    ) = q.eval([](Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x; });
                        intg(i,j,k,i_S_y    ) = q.eval([](Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y; });
                        intg(i,j,k,i_S_z    ) = q.eval([](Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z; });
                        intg(i,j,k,i_S_x2   ) = q.eval([](Real x, Real /*y*/, Real /*z*/) noexcept
                                                   { return x*x; });
                        intg(i,j,k,i_S_y2   ) = q.eval([](Real /*x*/, Real y, Real /*z*/) noexcept
                                                   { return y*y; });
                        intg(i,j,k,i_S_z2   ) = q.eval([](Real /*x*/, Real /*y*/, Real z) noexcept
                                                   { return z*z; });
                        intg(i,j,k,i_S_x_y  ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y; });
                        intg(i,j,k,i_S_x_z  ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z; });
                        intg(i,j,k,i_S_y_z  ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z; });
                        intg(i,j,k,i_S_x2_y ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y; });
                        intg(i,j,k,i_S_x2_z ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z; });
                        intg(i,j,k,i_S_x_y2 ) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*y*y; });
                        intg(i,j,k,i_S_y2_z ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z; });
                        intg(i,j,k,i_S_x_z2 ) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*z*z; });
                        intg(i,j,k,i_S_y_z2 ) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*z*z; });
                        intg(i,j,k,i_S_x2_y2) = q.eval([](Real x, Real y, Real /*z*/) noexcept
                                                   { return x*x*y*y; });
                        intg(i,j,k,i_S_x2_z2) = q.eval([](Real x, Real /*y*/, Real z) noexcept
                                                   { return x*x*z*z; });
                        intg(i,j,k,i_S_y2_z2) = q.eval([](Real /*x*/, Real y, Real z) noexcept
                                                   { return y*y*z*z; });
                        intg(i,j,k,i_S_xyz  ) = q.eval([](Real x, Real y, Real z) noexcept
                                                   { return x*y*z; });
                    }
                }
            }
        }
    }
#endif
}